

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGeneratorFactory.cxx
# Opt level: O0

void __thiscall cmCPackGeneratorFactory::~cmCPackGeneratorFactory(cmCPackGeneratorFactory *this)

{
  cmCPackGeneratorFactory *this_local;
  
  ~cmCPackGeneratorFactory(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

cmCPackGeneratorFactory::~cmCPackGeneratorFactory()
{
  cmDeleteAll(this->Generators);
}